

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getStringLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  Exception *in_RDI;
  uint8_t h;
  undefined4 in_stack_ffffffffffffffec;
  ExceptionType type;
  Exception *this_00;
  unsigned_long local_8;
  
  this_00 = in_RDI;
  bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12a0b8);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffec);
  if ((bVar1 < 0x40) || (0xbe < bVar1)) {
    if (bVar1 != 0xbf) {
      uVar3 = __cxa_allocate_exception(0x18);
      Exception::Exception(this_00,type,(char *)in_RDI);
      __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
    }
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12a0f9);
    local_8 = readIntegerFixed<unsigned_long,8ul>(puVar2 + 1);
  }
  else {
    local_8 = (unsigned_long)(int)(bVar1 - 0x40);
  }
  return local_8;
}

Assistant:

ValueLength getStringLength() const {
    uint8_t const h = head();

    if (h >= 0x40 && h <= 0xbe) {
      // short UTF-8 String
      return h - 0x40;
    }

    if (h == 0xbf) {
      // long UTF-8 String
      return readIntegerFixed<ValueLength, 8>(start() + 1);
    }

    throw Exception(Exception::InvalidValueType, "Expecting type String");
  }